

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_FindEntry(ktxHashList *pHead,char *key,ktxHashListEntry **ppEntry)

{
  void *__s1;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  long *in_RDX;
  char *in_RSI;
  long *in_RDI;
  char *_hj_key;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  ktxKVListEntry *kv;
  char *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  long local_28;
  ktx_error_code_e local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == (char *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    local_28 = 0;
    if (*in_RDI != 0) {
      local_30 = 0xfeedbeef;
      local_38 = 0x9e3779b9;
      local_34 = 0x9e3779b9;
      sVar5 = strlen(in_RSI);
      local_48 = in_RSI;
      for (local_3c = (uint)sVar5; 0xb < local_3c; local_3c = local_3c - 0xc) {
        iVar1 = (int)local_48[4] + local_48[5] * 0x100 + local_48[6] * 0x10000 +
                local_48[7] * 0x1000000 + local_38;
        local_30 = (int)local_48[8] + local_48[9] * 0x100 + local_48[10] * 0x10000 +
                   local_48[0xb] * 0x1000000 + local_30;
        uVar2 = local_30 >> 0xd ^
                (((int)*local_48 + local_48[1] * 0x100 + local_48[2] * 0x10000 +
                  local_48[3] * 0x1000000 + local_34) - iVar1) - local_30;
        uVar3 = uVar2 << 8 ^ (iVar1 - local_30) - uVar2;
        uVar4 = uVar3 >> 0xd ^ (local_30 - uVar2) - uVar3;
        uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
        local_34 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
        local_38 = local_34 << 10 ^ (uVar3 - uVar4) - local_34;
        local_30 = local_38 >> 0xf ^ (uVar4 - local_34) - local_38;
        local_48 = local_48 + 0xc;
      }
      sVar5 = strlen(in_RSI);
      local_30 = local_30 + (int)sVar5;
      switch(local_3c) {
      case 0xb:
        local_30 = local_48[10] * 0x1000000 + local_30;
      case 10:
        local_30 = local_48[9] * 0x10000 + local_30;
      case 9:
        local_30 = local_48[8] * 0x100 + local_30;
      case 8:
        local_38 = local_48[7] * 0x1000000 + local_38;
      case 7:
        local_38 = local_48[6] * 0x10000 + local_38;
      case 6:
        local_38 = local_48[5] * 0x100 + local_38;
      case 5:
        local_38 = (int)local_48[4] + local_38;
      case 4:
        local_34 = local_48[3] * 0x1000000 + local_34;
      case 3:
        local_34 = local_48[2] * 0x10000 + local_34;
      case 2:
        local_34 = local_48[1] * 0x100 + local_34;
      case 1:
        local_34 = (int)*local_48 + local_34;
      default:
        uVar2 = local_30 >> 0xd ^ (local_34 - local_38) - local_30;
        uVar3 = uVar2 << 8 ^ (local_38 - local_30) - uVar2;
        uVar4 = uVar3 >> 0xd ^ (local_30 - uVar2) - uVar3;
        uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
        uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
        uVar2 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
        uVar3 = uVar2 << 10 ^ (uVar3 - uVar4) - uVar2;
        uVar2 = (uVar3 >> 0xf ^ (uVar4 - uVar2) - uVar3) &
                *(int *)(*(long *)(*in_RDI + 0x20) + 8) - 1U;
        if (*(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10) == 0) {
          local_28 = 0;
        }
        else {
          local_28 = *(long *)(**(long **)(*in_RDI + 0x20) + (ulong)uVar2 * 0x10) -
                     *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        }
      }
      while (local_28 != 0) {
        iVar1 = *(int *)(local_28 + 0x50);
        sVar5 = strlen(in_RSI);
        if (iVar1 == (int)sVar5) {
          __s1 = *(void **)(local_28 + 0x48);
          sVar5 = strlen(in_RSI);
          iVar1 = memcmp(__s1,in_RSI,sVar5 & 0xffffffff);
          if (iVar1 == 0) break;
        }
        if (*(long *)(local_28 + 0x40) == 0) {
          local_28 = 0;
        }
        else {
          local_28 = *(long *)(local_28 + 0x40) - *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        }
      }
    }
    if (local_28 == 0) {
      local_4 = KTX_NOT_FOUND;
    }
    else {
      *in_RDX = local_28;
      local_4 = KTX_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_FindEntry(ktxHashList* pHead, const char* key,
                      ktxHashListEntry** ppEntry)
{
    if (pHead && key) {
        ktxKVListEntry* kv;

        HASH_FIND_STR( *pHead, key, kv );  /* kv: output pointer */

        if (kv) {
            *ppEntry = kv;
            return KTX_SUCCESS;
        } else
            return KTX_NOT_FOUND;
    } else
        return KTX_INVALID_VALUE;
}